

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall
CCommandLineOptions::SetByCommandLineArguments
          (CCommandLineOptions *this,int numberOfArguments,char **arguments)

{
  char *pcVar1;
  bool bVar2;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  char **ppcStack_28;
  int i;
  char **arguments_local;
  CCommandLineOptions *pCStack_18;
  int numberOfArguments_local;
  CCommandLineOptions *this_local;
  
  ppcStack_28 = arguments;
  arguments_local._4_4_ = numberOfArguments;
  pCStack_18 = this;
  ResetDefaults(this);
  this->optionsEnd = false;
  local_2c = 0;
  while( true ) {
    if (arguments_local._4_4_ <= local_2c) {
      return true;
    }
    pcVar1 = ppcStack_28[local_2c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    bVar2 = parseArgument(this,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (((bVar2 ^ 0xffU) & 1) != 0) break;
    bVar2 = IsInfoOnly(this);
    if (bVar2) {
      return true;
    }
    local_2c = local_2c + 1;
  }
  ResetDefaults(this);
  return false;
}

Assistant:

bool CCommandLineOptions::SetByCommandLineArguments( int numberOfArguments,
	const char* const arguments[] )
{
	ResetDefaults();
	optionsEnd = false;
	for( int i = 0; i < numberOfArguments; i++ ) {
		if( !parseArgument( arguments[i] ) ) {
			ResetDefaults();
			return false;
		}
		if( IsInfoOnly() ) {
			break;
		}
	}
	return true;
}